

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O1

void anon_unknown.dwarf_288fc5::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_2_5::Rgba> *p1,RgbaChannels channels
               ,LineOrder lorder,Compression comp)

{
  size_t yStride;
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  LineOrder LVar5;
  Compression CVar6;
  RgbaChannels RVar7;
  ostream *this;
  long *plVar8;
  LineOrder *pLVar9;
  Compression *pCVar10;
  Box2i *pBVar11;
  Box2i *pBVar12;
  float *pfVar13;
  V2f *pVVar14;
  undefined4 uVar15;
  size_t sVar16;
  half *phVar17;
  InputFile *pIVar18;
  uint uVar19;
  undefined4 in_register_00000034;
  Array2D<Imf_2_5::Rgba> *src;
  char *pcVar20;
  half *phVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  FromYca *pFVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  int iVar33;
  RgbaOutputFile out;
  Array2D<Imf_2_5::Rgba> p2;
  Header header;
  RgbaInputFile local_f8;
  long local_c0;
  Array2D<Imf_2_5::Rgba> local_b8;
  float local_a0;
  float local_9c;
  InputFile *local_98;
  FromYca *local_90;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Header local_68;
  
  src = (Array2D<Imf_2_5::Rgba> *)CONCAT44(in_register_00000034,width);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"channels ",9);
  uVar19 = height & 1;
  pcVar20 = "R";
  if (uVar19 == 0) {
    pcVar20 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar20,(ulong)uVar19);
  uVar2 = height & 2;
  pcVar20 = "G";
  if (uVar2 == 0) {
    pcVar20 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar20,(ulong)(uVar2 >> 1));
  uVar3 = height & 4;
  pcVar20 = "B";
  if (uVar3 == 0) {
    pcVar20 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar20,(ulong)(uVar3 >> 2));
  uVar25 = height & 8;
  pcVar20 = "A";
  if (uVar25 == 0) {
    pcVar20 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar20,(ulong)(uVar25 >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", line order ",0xd);
  this = (ostream *)std::ostream::operator<<(&std::cout,(LineOrder)p1);
  std::__ostream_insert<char,std::char_traits<char>>(this,", compression ",0xe);
  plVar8 = (long *)std::ostream::operator<<(this,channels);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  local_f8._vptr_RgbaInputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header(&local_68,0xed,0x77,1.0,(V2f *)&local_f8,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  pLVar9 = Imf_2_5::Header::lineOrder(&local_68);
  *pLVar9 = (LineOrder)p1;
  pCVar10 = Imf_2_5::Header::compression(&local_68);
  *pCVar10 = channels;
  remove(fileName);
  iVar4 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            ((RgbaOutputFile *)&local_f8,fileName,&local_68,height,iVar4);
  local_78._M_allocated_capacity = (ulong)uVar19;
  Imf_2_5::RgbaOutputFile::setFrameBuffer((RgbaOutputFile *)&local_f8,src->_data,1,0xed);
  iVar4 = 0x77;
  do {
    fVar27 = (float)Imath_2_5::Rand32::nextf();
    iVar24 = (int)(fVar27 * (float)iVar4 + 0.5);
    Imf_2_5::RgbaOutputFile::writePixels((RgbaOutputFile *)&local_f8,iVar24);
    iVar4 = iVar4 - iVar24;
  } while (iVar4 != 0);
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile((RgbaOutputFile *)&local_f8);
  iVar4 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile(&local_f8,fileName,iVar4);
  pBVar11 = Imf_2_5::RgbaInputFile::dataWindow(&local_f8);
  uVar1 = local_78._M_allocated_capacity;
  iVar4 = (pBVar11->max).x;
  pFVar26 = (FromYca *)(long)(pBVar11->min).x;
  local_78._8_8_ = (long)iVar4 - (long)pFVar26;
  yStride = local_78._8_8_ + 1;
  local_88._M_p = (pointer)(long)(pBVar11->max).y;
  pIVar18 = (InputFile *)(long)(pBVar11->min).y;
  local_80 = (long)local_88._M_p - (long)pIVar18;
  local_c0 = local_80 + 1;
  local_b8._sizeX = local_c0;
  local_b8._sizeY = yStride;
  local_b8._data =
       (Rgba *)operator_new__(-(ulong)(local_c0 * yStride >> 0x3d != 0) | local_c0 * yStride * 8);
  sVar16 = yStride;
  local_98 = pIVar18;
  local_90 = pFVar26;
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (&local_f8,local_b8._data + (-(long)pIVar18 * yStride - (long)pFVar26),1,yStride);
  uVar15 = (undefined4)sVar16;
  Imf_2_5::RgbaInputFile::readPixels(&local_f8,(pBVar11->min).y,(pBVar11->max).y);
  pBVar11 = Imf_2_5::RgbaInputFile::displayWindow(&local_f8);
  pBVar12 = Imf_2_5::Header::displayWindow(&local_68);
  iVar24 = -(uint)((pBVar12->min).x == (pBVar11->min).x);
  iVar32 = -(uint)((pBVar12->min).y == (pBVar11->min).y);
  auVar28._4_4_ = iVar24;
  auVar28._0_4_ = iVar24;
  auVar28._8_4_ = iVar32;
  auVar28._12_4_ = iVar32;
  iVar24 = movmskpd(uVar15,auVar28);
  if ((iVar24 != 3) ||
     (iVar32 = -(uint)((pBVar12->max).x == (pBVar11->max).x),
     iVar33 = -(uint)((pBVar12->max).y == (pBVar11->max).y), auVar29._4_4_ = iVar32,
     auVar29._0_4_ = iVar32, auVar29._8_4_ = iVar33, auVar29._12_4_ = iVar33,
     iVar32 = movmskpd((int)pBVar12,auVar29), iVar32 != 3)) {
    __assert_fail("in.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8b,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  pBVar11 = Imf_2_5::RgbaInputFile::dataWindow(&local_f8);
  pBVar12 = Imf_2_5::Header::dataWindow(&local_68);
  iVar32 = -(uint)((pBVar12->min).x == (pBVar11->min).x);
  iVar33 = -(uint)((pBVar12->min).y == (pBVar11->min).y);
  auVar30._4_4_ = iVar32;
  auVar30._0_4_ = iVar32;
  auVar30._8_4_ = iVar33;
  auVar30._12_4_ = iVar33;
  iVar24 = movmskpd(iVar24,auVar30);
  if ((iVar24 != 3) ||
     (iVar24 = -(uint)((pBVar12->max).x == (pBVar11->max).x),
     iVar32 = -(uint)((pBVar12->max).y == (pBVar11->max).y), auVar31._4_4_ = iVar24,
     auVar31._0_4_ = iVar24, auVar31._8_4_ = iVar32, auVar31._12_4_ = iVar32,
     iVar24 = movmskpd((int)pBVar12,auVar31), iVar24 != 3)) {
    __assert_fail("in.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8c,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar27 = Imf_2_5::RgbaInputFile::pixelAspectRatio(&local_f8);
  pfVar13 = Imf_2_5::Header::pixelAspectRatio(&local_68);
  if ((fVar27 == *pfVar13) && (!NAN(fVar27) && !NAN(*pfVar13))) {
    Imf_2_5::RgbaInputFile::screenWindowCenter((RgbaInputFile *)&local_a0);
    pVVar14 = Imf_2_5::Header::screenWindowCenter(&local_68);
    if ((((local_a0 != pVVar14->x) || (NAN(local_a0) || NAN(pVVar14->x))) ||
        (local_9c != pVVar14->y)) || (NAN(local_9c) || NAN(pVVar14->y))) {
      __assert_fail("in.screenWindowCenter() == header.screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x8e,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    fVar27 = Imf_2_5::RgbaInputFile::screenWindowWidth(&local_f8);
    pfVar13 = Imf_2_5::Header::screenWindowWidth(&local_68);
    if ((fVar27 != *pfVar13) || (NAN(fVar27) || NAN(*pfVar13))) {
      __assert_fail("in.screenWindowWidth() == header.screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x8f,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    LVar5 = Imf_2_5::RgbaInputFile::lineOrder(&local_f8);
    pLVar9 = Imf_2_5::Header::lineOrder(&local_68);
    if (LVar5 != *pLVar9) {
      __assert_fail("in.lineOrder() == header.lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x90,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    CVar6 = Imf_2_5::RgbaInputFile::compression(&local_f8);
    pCVar10 = Imf_2_5::Header::compression(&local_68);
    if (CVar6 == *pCVar10) {
      RVar7 = Imf_2_5::RgbaInputFile::channels(&local_f8);
      if (RVar7 != height) {
        __assert_fail("in.channels() == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                     );
      }
      CVar6 = Imf_2_5::RgbaInputFile::compression(&local_f8);
      if ((CVar6 == B44_COMPRESSION) ||
         (CVar6 = Imf_2_5::RgbaInputFile::compression(&local_f8), CVar6 == B44A_COMPRESSION)) {
        compareB44((int)yStride,(int)local_c0,src,&local_b8,height);
      }
      else {
        CVar6 = Imf_2_5::RgbaInputFile::compression(&local_f8);
        if ((CVar6 == DWAA_COMPRESSION) ||
           (CVar6 = Imf_2_5::RgbaInputFile::compression(&local_f8), CVar6 == DWAB_COMPRESSION)) {
          compareDwa((int)yStride,(int)local_c0,src,&local_b8,height);
        }
        else if (-1 < (int)local_80) {
          phVar17 = &(local_b8._data)->a;
          phVar21 = &src->_data->a;
          uVar22 = 0;
          do {
            if (-1 < (int)local_78._8_4_) {
              uVar23 = 0;
              do {
                if ((int)uVar1 == 0) {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4 + -3]._h * 4
                                     );
                  if ((fVar27 != 0.0) || (NAN(fVar27))) {
                    __assert_fail("p2[y][x].r == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xa7,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4 + -3]._h * 4
                                     );
                  pfVar13 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar23 * 4 + -3]._h * 4
                                     );
                  if ((fVar27 != *pfVar13) || (NAN(fVar27) || NAN(*pfVar13))) {
                    __assert_fail("p2[y][x].r == p1[y][x].r",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xa5,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                if (uVar2 == 0) {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4 + -2]._h * 4
                                     );
                  if ((fVar27 != 0.0) || (NAN(fVar27))) {
                    __assert_fail("p2[y][x].g == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xac,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4 + -2]._h * 4
                                     );
                  pfVar13 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar23 * 4 + -2]._h * 4
                                     );
                  if ((fVar27 != *pfVar13) || (NAN(fVar27) || NAN(*pfVar13))) {
                    __assert_fail("p2[y][x].g == p1[y][x].g",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xaa,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                if (uVar3 == 0) {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4 + -1]._h * 4
                                     );
                  if ((fVar27 != 0.0) || (NAN(fVar27))) {
                    __assert_fail("p2[y][x].b == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xb1,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4 + -1]._h * 4
                                     );
                  pfVar13 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar23 * 4 + -1]._h * 4
                                     );
                  if ((fVar27 != *pfVar13) || (NAN(fVar27) || NAN(*pfVar13))) {
                    __assert_fail("p2[y][x].b == p1[y][x].b",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xaf,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                if (uVar25 == 0) {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4]._h * 4);
                  if ((fVar27 != 1.0) || (NAN(fVar27))) {
                    __assert_fail("p2[y][x].a == 1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xb6,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                else {
                  fVar27 = *(float *)((long)&half::_toFloat + (ulong)phVar17[uVar23 * 4]._h * 4);
                  pfVar13 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar23 * 4]._h * 4);
                  if ((fVar27 != *pfVar13) || (NAN(fVar27) || NAN(*pfVar13))) {
                    __assert_fail("p2[y][x].a == p1[y][x].a",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                  ,0xb4,
                                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                                 );
                  }
                }
                uVar23 = uVar23 + 1;
              } while ((iVar4 - (int)local_90) + 1 != uVar23);
            }
            uVar22 = uVar22 + 1;
            phVar17 = phVar17 + local_b8._sizeY * 4;
            phVar21 = phVar21 + src->_sizeY * 4;
          } while (uVar22 != ((int)local_88._M_p - (int)local_98) + 1);
        }
      }
      if (local_b8._data != (Rgba *)0x0) {
        operator_delete__(local_b8._data);
      }
      Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_f8);
      remove(fileName);
      Imf_2_5::Header::~Header(&local_68);
      return;
    }
    __assert_fail("in.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x91,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  __assert_fail("in.pixelAspectRatio() == header.pixelAspectRatio()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                ,0x8d,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadRGBA (const char fileName[],
	       int width,
	       int height,
	       const Array2D<Rgba> &p1,
	       RgbaChannels channels,
	       LineOrder lorder,
	       Compression comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the orignal.
    //

    cout << "channels " <<
	    ((channels & WRITE_R)? "R": "") <<
	    ((channels & WRITE_G)? "G": "") <<
	    ((channels & WRITE_B)? "B": "") <<
	    ((channels & WRITE_A)? "A": "") <<
	    ", line order " << lorder <<
	    ", compression " << comp << endl;

    Header header (width, height);
    header.lineOrder() = lorder;
    header.compression() = comp;

    {
	remove (fileName);
	RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);
        
        int numLeft = height;
        int numWrite = 1;

	//
        // Iterate over all scanlines, and write them out in random-size chunks
	//

        while (numLeft)
        {
            numWrite = int (rand1.nextf() * numLeft + 0.5f);
            out.writePixels (numWrite);
            numLeft -= numWrite;
        }
    }

    {
	RgbaInputFile in (fileName);
	const Box2i &dw = in.dataWindow();
	
	int w = dw.max.x - dw.min.x + 1;
	int h = dw.max.y - dw.min.y + 1;
	int dx = dw.min.x;
	int dy = dw.min.y;

	Array2D<Rgba> p2 (h, w);
	in.setFrameBuffer (&p2[-dy][-dx], 1, w);
	in.readPixels (dw.min.y, dw.max.y);

	assert (in.displayWindow() == header.displayWindow());
	assert (in.dataWindow() == header.dataWindow());
	assert (in.pixelAspectRatio() == header.pixelAspectRatio());
	assert (in.screenWindowCenter() == header.screenWindowCenter());
	assert (in.screenWindowWidth() == header.screenWindowWidth());
	assert (in.lineOrder() == header.lineOrder());
	assert (in.compression() == header.compression());
	assert (in.channels() == channels);

	if (in.compression() == B44_COMPRESSION ||
	    in.compression() == B44A_COMPRESSION)
	{
	    compareB44 (w, h, p1, p2, channels);
	}
	else if (in.compression() == DWAA_COMPRESSION ||
	         in.compression() == DWAB_COMPRESSION)
	{
	    compareDwa (w, h, p1, p2, channels);
	}
	else
	{
	    for (int y = 0; y < h; ++y)
	    {
		for (int x = 0; x < w; ++x)
		{
		    if (channels & WRITE_R)
			assert (p2[y][x].r == p1[y][x].r);
		    else
			assert (p2[y][x].r == 0);

		    if (channels & WRITE_G)
			assert (p2[y][x].g == p1[y][x].g);
		    else
			assert (p2[y][x].g == 0);

		    if (channels & WRITE_B)
			assert (p2[y][x].b == p1[y][x].b);
		    else
			assert (p2[y][x].b == 0);

		    if (channels & WRITE_A)
			assert (p2[y][x].a == p1[y][x].a);
		    else
			assert (p2[y][x].a == 1);
		}
	    }
	}
    }

    remove (fileName);
}